

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O1

bool __thiscall
tst_InsertProxyModel::testCommitSubclass::InsertProxyModelCommit::validColumn
          (InsertProxyModelCommit *this)

{
  char cVar1;
  undefined4 uVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  int iVar6;
  anon_union_24_3_e3d07ef4_for_data local_88;
  ulong local_70;
  ulong local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  long *local_38;
  
  lVar4 = QAbstractProxyModel::sourceModel();
  if (lVar4 != 0) {
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    local_88._forAlignment = -NAN;
    local_88._8_8_ = 0;
    local_88._16_8_ = 0;
    uVar2 = (**(code **)(*plVar5 + 0x80))(plVar5,&local_88);
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    local_88._forAlignment = -NAN;
    local_88._8_8_ = 0;
    local_88._16_8_ = 0;
    iVar3 = (**(code **)(*plVar5 + 0x78))(plVar5,&local_88);
    if (iVar3 < 1) {
      return 0 < iVar3;
    }
    iVar6 = 0;
    do {
      local_60 = 0xffffffffffffffff;
      local_58 = 0;
      uStack_50 = 0;
      (**(code **)(*(long *)this + 0x60))(local_48,this,iVar6,uVar2,&local_60);
      if (local_38 == (long *)0x0) {
        local_88.shared = (PrivateShared *)0x0;
        local_88._8_8_ = 0;
        local_88._16_8_ = 0;
        local_70 = 2;
      }
      else {
        (**(code **)(*local_38 + 0x90))(&local_88,local_38,local_48,0);
      }
      local_68 = local_70 & 0xfffffffffffffffc;
      cVar1 = QMetaType::isValid();
      QVariant::~QVariant((QVariant *)&local_88);
      if (cVar1 != '\0') {
        return true;
      }
      iVar6 = iVar6 + 1;
    } while (iVar3 != iVar6);
  }
  return false;
}

Assistant:

bool validColumn() const Q_DECL_OVERRIDE
        {
            if (!sourceModel())
                return false;
            const int sourceCols = sourceModel()->columnCount();
            const int sourceRows = sourceModel()->rowCount();
            for (int i = 0; i < sourceRows; ++i) {
                if (index(i, sourceCols).data().isValid())
                    return true;
            }
            return false;
        }